

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

Btree tree_5_3::search_2(Btree t,int e)

{
  Btree p;
  
  if (t != (Btree)0x0) {
    do {
      if (t->data == e) {
        return t;
      }
      t = (&t->left)[t->data <= e];
    } while (t != (node *)0x0);
  }
  return (Btree)0x0;
}

Assistant:

Btree search_2(Btree t, int e) {
        Btree p = t;
        while (p != nullptr && p->data != e) {
            if (e < p->data)
                p = p->left;
            else
                p = p->right;
        }
        return p;
    }